

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O0

QList<QGraphicsItem_*> * __thiscall
QGraphicsSceneBspTreeIndexPrivate::estimateItems
          (QGraphicsSceneBspTreeIndexPrivate *this,QRectF *rect,SortOrder order,
          bool onlyTopLevelItems)

{
  bool bVar1;
  QGraphicsSceneBspTree *this_00;
  QGraphicsItem *this_01;
  qsizetype qVar2;
  const_reference ppQVar3;
  QGraphicsItemPrivate *pQVar4;
  undefined4 in_ECX;
  QRectF *in_RDX;
  QGraphicsSceneBspTreeIndexPrivate *in_RSI;
  QGraphicsSceneBspTreeIndexPrivate *in_RDI;
  undefined1 in_R8B;
  long in_FS_OFFSET;
  QList<QGraphicsItem_*> *unaff_retaddr;
  int i;
  QGraphicsSceneBspTreeIndex *q;
  QList<QGraphicsItem_*> *rectItems;
  QGraphicsItem *item;
  parameter_type in_stack_ffffffffffffff98;
  QList<QGraphicsItem_*> *in_stack_ffffffffffffffa0;
  QGraphicsSceneBspTreeIndexPrivate *this_02;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar5;
  undefined4 in_stack_ffffffffffffffc4;
  undefined3 in_stack_ffffffffffffffd0;
  uint uVar6;
  QGraphicsSceneBspTreeIndexPrivate *this_03;
  long lVar7;
  
  lVar7 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = CONCAT13(in_R8B,in_stack_ffffffffffffffd0) & 0x1ffffff;
  this_02 = in_RDI;
  this_03 = in_RSI;
  this_00 = (QGraphicsSceneBspTree *)q_func(in_RSI);
  if (((uVar6 & 0x1000000) == 0) || (bVar1 = QRectF::isNull(in_RDX), !bVar1)) {
    purgeRemovedItems(this_02);
    _q_updateSortCache(this_03);
    *(undefined1 **)&in_RDI->super_QGraphicsSceneIndexPrivate = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(in_RDI->super_QGraphicsSceneIndexPrivate).field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(in_RDI->super_QGraphicsSceneIndexPrivate).field_0x10 = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneBspTree::items
              (this_00,(QRectF *)
                       (CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) &
                       0xffffffffffffff),SUB81((ulong)in_RSI >> 0x38,0));
    if ((uVar6 & 0x1000000) == 0) {
      QList<QGraphicsItem_*>::operator+=
                (in_stack_ffffffffffffffa0,(QList<QGraphicsItem_*> *)in_stack_ffffffffffffff98);
    }
    else {
      iVar5 = 0;
      while( true ) {
        this_01 = (QGraphicsItem *)(long)iVar5;
        qVar2 = QList<QGraphicsItem_*>::size(&in_RSI->untransformableItems);
        if (qVar2 <= (long)this_01) break;
        ppQVar3 = QList<QGraphicsItem_*>::at
                            ((QList<QGraphicsItem_*> *)this_01,(qsizetype)in_stack_ffffffffffffff98)
        ;
        pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&(*ppQVar3)->d_ptr);
        if (pQVar4->parent == (QGraphicsItem *)0x0) {
          QList<QGraphicsItem_*>::operator<<
                    ((QList<QGraphicsItem_*> *)this_01,in_stack_ffffffffffffff98);
        }
        else {
          QGraphicsItem::topLevelItem(this_01);
          bVar1 = QListSpecialMethodsBase<QGraphicsItem*>::contains<QGraphicsItem*>
                            ((QListSpecialMethodsBase<QGraphicsItem_*> *)this_01,
                             (QGraphicsItem **)in_stack_ffffffffffffff98);
          if (!bVar1) {
            QList<QGraphicsItem_*>::operator<<
                      ((QList<QGraphicsItem_*> *)this_01,in_stack_ffffffffffffff98);
          }
        }
        iVar5 = iVar5 + 1;
      }
    }
    sortItems(unaff_retaddr,(SortOrder)((ulong)lVar7 >> 0x20),SUB81((ulong)lVar7 >> 0x18,0),
              SUB81((ulong)lVar7 >> 0x10,0));
  }
  else {
    QGraphicsSceneIndex::estimateTopLevelItems
              ((QGraphicsSceneIndex *)in_RDX,(QRectF *)CONCAT44(in_ECX,uVar6),
               (SortOrder)((ulong)this_00 >> 0x20));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar7) {
    return (QList<QGraphicsItem_*> *)this_02;
  }
  __stack_chk_fail();
}

Assistant:

QList<QGraphicsItem *> QGraphicsSceneBspTreeIndexPrivate::estimateItems(const QRectF &rect, Qt::SortOrder order,
                                                                        bool onlyTopLevelItems)
{
    Q_Q(QGraphicsSceneBspTreeIndex);
    if (onlyTopLevelItems && rect.isNull())
        return q->QGraphicsSceneIndex::estimateTopLevelItems(rect, order);

    purgeRemovedItems();
    _q_updateSortCache();
    Q_ASSERT(unindexedItems.isEmpty());

    QList<QGraphicsItem *> rectItems = bsp.items(rect, onlyTopLevelItems);
    if (onlyTopLevelItems) {
        for (int i = 0; i < untransformableItems.size(); ++i) {
            QGraphicsItem *item = untransformableItems.at(i);
            if (!item->d_ptr->parent) {
                rectItems << item;
            } else {
                item = item->topLevelItem();
                if (!rectItems.contains(item))
                    rectItems << item;
            }
        }
    } else {
        rectItems += untransformableItems;
    }

    sortItems(&rectItems, order, sortCacheEnabled, onlyTopLevelItems);
    return rectItems;
}